

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O0

void __thiscall
testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>::
depart(linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> *this)

{
  void *pvVar1;
  bool bVar2;
  TestInfo *in_RDI;
  linked_ptr_internal *in_stack_00000008;
  
  bVar2 = linked_ptr_internal::depart(in_stack_00000008);
  if ((bVar2) && (pvVar1 = *(void **)&in_RDI->test_case_base_name, pvVar1 != (void *)0x0)) {
    ParameterizedTestCaseInfo<PushPopTest>::TestInfo::~TestInfo(in_RDI);
    operator_delete(pvVar1);
  }
  return;
}

Assistant:

void depart() {
    if (link_.depart()) delete value_;
  }